

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O1

void __thiscall QGraphicsWidget::initStyleOption(QGraphicsWidget *this,QStyleOption *option)

{
  QGraphicsItem *this_00;
  byte *pbVar1;
  QPalettePrivate *pQVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  QGraphicsWidget *pQVar7;
  QRectF *pQVar8;
  ulong uVar9;
  ColorGroup CVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  QFont fnt;
  undefined8 local_50;
  undefined1 local_48 [16];
  double local_38;
  double dStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  this_00 = (QGraphicsItem *)(this + 0x10);
  bVar5 = QGraphicsItem::isEnabled(this_00);
  if (bVar5) {
    *(byte *)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  bVar5 = QGraphicsItem::hasFocus(this_00);
  if (bVar5) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  bVar5 = QGraphicsItem::isUnderMouse(this_00);
  if (bVar5) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  pQVar7 = QGraphicsItem::window(this_00);
  if (pQVar7 != (QGraphicsWidget *)0x0) {
    bVar5 = QGraphicsItem::isActive(&(pQVar7->super_QGraphicsObject).super_QGraphicsItem);
    if (bVar5) {
      pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 2);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  bVar5 = QGraphicsItem::isWindow(this_00);
  if (bVar5) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  option->direction = *(uint *)(*(long *)(this + 0x18) + 0x1b4) >> 1 & RightToLeft;
  pQVar8 = QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(this + 0x20));
  auVar13._0_8_ =
       (double)((ulong)(local_38 + 0.0) & 0x8000000000000000 | 0x3fe0000000000000) + local_38 + 0.0;
  auVar13._8_8_ =
       (double)((ulong)(dStack_30 + 0.0) & 0x8000000000000000 | 0x3fe0000000000000) +
       dStack_30 + 0.0;
  auVar13 = minpd(_DAT_0066f5d0,auVar13);
  auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar13._8_8_);
  auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar13._0_8_);
  uVar6 = movmskpd((int)pQVar8,auVar12);
  uVar11 = 0x7fffffff00000000;
  if ((uVar6 & 2) != 0) {
    uVar11 = (ulong)((int)auVar13._8_8_ - 1) << 0x20;
  }
  uVar9 = 0x7fffffff;
  if ((uVar6 & 1) != 0) {
    uVar9 = (ulong)((int)auVar13._0_8_ - 1);
  }
  (option->rect).x1 = 0;
  (option->rect).y1 = 0;
  (option->rect).x2 = (Representation)(int)(uVar9 | uVar11);
  (option->rect).y2 = (Representation)(int)((uVar9 | uVar11) >> 0x20);
  QPalette::QPalette((QPalette *)local_48,(QPalette *)(*(long *)(this + 0x18) + 0x188));
  CVar10 = (option->palette).currentGroup;
  (option->palette).currentGroup = local_48._8_4_;
  local_48._8_4_ = CVar10;
  pQVar2 = (option->palette).d;
  (option->palette).d = (QPalettePrivate *)local_48._0_8_;
  local_48._0_8_ = pQVar2;
  QPalette::~QPalette((QPalette *)local_48);
  bVar5 = QGraphicsItem::isEnabled(this_00);
  CVar10 = Disabled;
  if (bVar5) {
    bVar5 = QGraphicsItem::isActive(this_00);
    CVar10 = (uint)!bVar5 * 2;
  }
  (option->palette).currentGroup = CVar10;
  lVar3 = *(long *)(this + 0x18);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)local_48,(QFont *)(lVar3 + 0x1a0));
  local_48._8_4_ = local_48._8_4_ | *(ColorGroup *)(lVar3 + 0x1b0);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_50,(QFont *)local_48);
  uVar4 = *(undefined8 *)&option->fontMetrics;
  *(undefined8 *)&option->fontMetrics = local_50;
  local_50 = uVar4;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_50);
  QFont::~QFont((QFont *)local_48);
  option->styleObject = (QObject *)this;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::initStyleOption(QStyleOption *option) const
{
    Q_ASSERT(option);

    option->state = QStyle::State_None;
    if (isEnabled())
        option->state |= QStyle::State_Enabled;
    if (hasFocus())
        option->state |= QStyle::State_HasFocus;
    // if (window->testAttribute(Qt::WA_KeyboardFocusChange)) // ### Window
    //     option->state |= QStyle::State_KeyboardFocusChange;
    if (isUnderMouse())
        option->state |= QStyle::State_MouseOver;
    if (QGraphicsWidget *w = window()) {
        if (w->isActiveWindow())
            option->state |= QStyle::State_Active;
    }
    if (isWindow())
        option->state |= QStyle::State_Window;
    /*
      ###
#ifdef QT_KEYPAD_NAVIGATION
    if (widget->hasEditFocus())
        state |= QStyle::State_HasEditFocus;
#endif
    */
    option->direction = layoutDirection();
    option->rect = rect().toRect(); // ### truncation!
    option->palette = palette();
    if (!isEnabled()) {
        option->palette.setCurrentColorGroup(QPalette::Disabled);
    } else if (isActiveWindow()) {
        option->palette.setCurrentColorGroup(QPalette::Active);
    } else {
        option->palette.setCurrentColorGroup(QPalette::Inactive);
    }
    option->fontMetrics = QFontMetrics(font());
    option->styleObject = const_cast<QGraphicsWidget *>(this);
}